

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::find_non_soo<long>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
           *this,key_arg<long> *key,size_t hash)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  bool bVar21;
  ushort uVar22;
  ctrl_t *pcVar23;
  slot_type *psVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  iterator iVar31;
  iterator iVar32;
  __m128i match;
  ulong local_90;
  ctrl_t *local_78;
  anon_union_8_1_a8a14541_for_iterator_2 local_68;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  
  uVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (uVar2 == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe2a,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>, K = long]"
                 );
  }
  if (uVar2 == 0) {
LAB_0020810a:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                 );
  }
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  local_90 = (hash >> 7 ^
             (ulong)(this->settings_).
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control >> 0xc) & uVar2;
  pcVar23 = control(this);
  auVar28 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar28 = pshuflw(auVar28,auVar28,0);
  uVar25 = 0;
  do {
    pcVar1 = pcVar23 + local_90;
    cVar5 = *pcVar1;
    cVar6 = pcVar1[1];
    cVar7 = pcVar1[2];
    cVar8 = pcVar1[3];
    cVar9 = pcVar1[4];
    cVar10 = pcVar1[5];
    cVar11 = pcVar1[6];
    cVar12 = pcVar1[7];
    cVar13 = pcVar1[8];
    cVar14 = pcVar1[9];
    cVar15 = pcVar1[10];
    cVar16 = pcVar1[0xb];
    cVar17 = pcVar1[0xc];
    cVar18 = pcVar1[0xd];
    cVar19 = pcVar1[0xe];
    cVar20 = pcVar1[0xf];
    local_58 = auVar28[0];
    cStack_57 = auVar28[1];
    cStack_56 = auVar28[2];
    cStack_55 = auVar28[3];
    auVar29[0] = -(local_58 == cVar5);
    auVar29[1] = -(cStack_57 == cVar6);
    auVar29[2] = -(cStack_56 == cVar7);
    auVar29[3] = -(cStack_55 == cVar8);
    auVar29[4] = -(local_58 == cVar9);
    auVar29[5] = -(cStack_57 == cVar10);
    auVar29[6] = -(cStack_56 == cVar11);
    auVar29[7] = -(cStack_55 == cVar12);
    auVar29[8] = -(local_58 == cVar13);
    auVar29[9] = -(cStack_57 == cVar14);
    auVar29[10] = -(cStack_56 == cVar15);
    auVar29[0xb] = -(cStack_55 == cVar16);
    auVar29[0xc] = -(local_58 == cVar17);
    auVar29[0xd] = -(cStack_57 == cVar18);
    auVar29[0xe] = -(cStack_56 == cVar19);
    auVar29[0xf] = -(cStack_55 == cVar20);
    uVar22 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
    uVar26 = (uint)uVar22;
    while( true ) {
      iVar31.field_1.slot_ = local_68.slot_;
      iVar31.ctrl_ = local_78;
      if (uVar22 == 0) break;
      uVar4 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      psVar24 = slot_array(this);
      uVar27 = uVar4 + local_90 & uVar2;
      if (psVar24[uVar27] == *key) {
        iVar31 = iterator_at(this,uVar27);
        break;
      }
      uVar22 = (ushort)(uVar26 - 1) & (ushort)uVar26;
      uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar22);
    }
    local_68 = iVar31.field_1;
    local_78 = iVar31.ctrl_;
    if (uVar22 != 0) {
LAB_002080ae:
      bVar21 = false;
      uVar27 = uVar25;
    }
    else {
      auVar30[0] = -(cVar5 == kEmpty);
      auVar30[1] = -(cVar6 == kEmpty);
      auVar30[2] = -(cVar7 == kEmpty);
      auVar30[3] = -(cVar8 == kEmpty);
      auVar30[4] = -(cVar9 == kEmpty);
      auVar30[5] = -(cVar10 == kEmpty);
      auVar30[6] = -(cVar11 == kEmpty);
      auVar30[7] = -(cVar12 == kEmpty);
      auVar30[8] = -(cVar13 == kEmpty);
      auVar30[9] = -(cVar14 == kEmpty);
      auVar30[10] = -(cVar15 == kEmpty);
      auVar30[0xb] = -(cVar16 == kEmpty);
      auVar30[0xc] = -(cVar17 == kEmpty);
      auVar30[0xd] = -(cVar18 == kEmpty);
      auVar30[0xe] = -(cVar19 == kEmpty);
      auVar30[0xf] = -(cVar20 == kEmpty);
      if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar30 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar30 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar30 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar30 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar30 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar20 == kEmpty) {
        AssertNotDebugCapacity(this);
        local_78 = (ctrl_t *)0x0;
        goto LAB_002080ae;
      }
      uVar3 = (this->settings_).
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if (uVar3 == 0) goto LAB_0020810a;
      uVar27 = uVar25 + 0x10;
      if (uVar3 < uVar27) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>, K = long]"
                     );
      }
      local_90 = local_90 + uVar25 + 0x10 & uVar2;
      bVar21 = true;
    }
    uVar25 = uVar27;
    if (!bVar21) {
      iVar32.field_1.slot_ = local_68.slot_;
      iVar32.ctrl_ = local_78;
      return iVar32;
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }